

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_structs.hpp
# Opt level: O3

bool operator==(Derived2 *x,Derived2 *y)

{
  size_t __n;
  int iVar1;
  
  if ((x->super_Derived1).super_Base2.super_Base1.a != (y->super_Derived1).super_Base2.super_Base1.a
     ) {
    return false;
  }
  if (((((x->super_Derived1).super_Base2.b == (y->super_Derived1).super_Base2.b) &&
       (__n = (x->super_Derived1).super_Base3.c._M_string_length,
       __n == (y->super_Derived1).super_Base3.c._M_string_length)) &&
      ((__n == 0 ||
       (iVar1 = bcmp((x->super_Derived1).super_Base3.c._M_dataplus._M_p,
                     (y->super_Derived1).super_Base3.c._M_dataplus._M_p,__n), iVar1 == 0)))) &&
     ((x->super_Derived1).d == (y->super_Derived1).d)) {
    return (x->super_Derived1).e == (y->super_Derived1).e;
  }
  return false;
}

Assistant:

bool operator==(const Derived2& x, const Derived2& y)
  {
    return x.a == y.a
      &&   x.b == y.b
      &&   x.c == y.c
      &&   x.d == y.d
      &&   x.e == y.e;
  }